

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractbutton.cpp
# Opt level: O0

void QAbstractButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSize *pQVar1;
  bool bVar2;
  int iVar3;
  QAbstractButton *this;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QAbstractButton *_t;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QKeySequence *in_stack_ffffffffffffff40;
  QSize *in_stack_ffffffffffffff48;
  bool down;
  QAbstractButton *in_stack_ffffffffffffff50;
  QKeySequence local_38 [8];
  QSize local_30;
  QIcon local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff50 = (QAbstractButton *)(ulong)in_EDX;
    bVar2 = SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0);
    switch(in_stack_ffffffffffffff50) {
    case (QAbstractButton *)0x0:
      pressed((QAbstractButton *)0x5014f8);
      break;
    case (QAbstractButton *)0x1:
      released((QAbstractButton *)0x501507);
      break;
    case (QAbstractButton *)0x2:
      clicked((QAbstractButton *)0x501526,bVar2);
      break;
    case (QAbstractButton *)0x3:
      clicked((QAbstractButton *)0x501537,bVar2);
      break;
    case (QAbstractButton *)0x4:
      toggled((QAbstractButton *)0x501553,bVar2);
      break;
    case (QAbstractButton *)0x5:
      setIconSize(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      break;
    case (QAbstractButton *)0x6:
      animateClick((QAbstractButton *)in_stack_ffffffffffffff40);
      break;
    case (QAbstractButton *)0x7:
      click((QAbstractButton *)in_stack_ffffffffffffff48);
      break;
    case (QAbstractButton *)0x8:
      toggle((QAbstractButton *)in_stack_ffffffffffffff40);
      break;
    case (QAbstractButton *)0x9:
      setChecked(in_stack_ffffffffffffff50,SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
    }
  }
  if ((in_ESI != 5) ||
     ((((bVar2 = QtMocHelpers::indexOfMethod<void(QAbstractButton::*)()>
                           (in_RCX,(void **)pressed,0,0), !bVar2 &&
        (bVar2 = QtMocHelpers::indexOfMethod<void(QAbstractButton::*)()>
                           (in_RCX,(void **)released,0,1), !bVar2)) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QAbstractButton::*)(bool)>
                          (in_RCX,(void **)clicked,0,2), !bVar2)) &&
      (bVar2 = QtMocHelpers::indexOfMethod<void(QAbstractButton::*)(bool)>
                         (in_RCX,(void **)toggled,0,4), !bVar2)))) {
    if (in_ESI == 1) {
      pQVar1 = *(QSize **)in_RCX;
      in_stack_ffffffffffffff48 = (QSize *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff48) {
      case (QSize *)0x0:
        text((QAbstractButton *)in_stack_ffffffffffffff48);
        QString::operator=((QString *)in_stack_ffffffffffffff40,
                           (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
        ;
        QString::~QString((QString *)0x501717);
        break;
      case (QSize *)0x1:
        icon((QAbstractButton *)in_stack_ffffffffffffff48);
        QIcon::operator=((QIcon *)in_stack_ffffffffffffff50,(QIcon *)in_stack_ffffffffffffff48);
        QIcon::~QIcon(local_28);
        break;
      case (QSize *)0x2:
        local_30 = iconSize(in_stack_ffffffffffffff50);
        *pQVar1 = local_30;
        break;
      case (QSize *)0x3:
        shortcut((QAbstractButton *)in_stack_ffffffffffffff48);
        QKeySequence::operator=
                  (in_stack_ffffffffffffff40,
                   (QKeySequence *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        QKeySequence::~QKeySequence(local_38);
        break;
      case (QSize *)0x4:
        bVar2 = isCheckable((QAbstractButton *)in_stack_ffffffffffffff40);
        *(bool *)&(pQVar1->wd).m_i = bVar2;
        break;
      case (QSize *)0x5:
        bVar2 = isChecked((QAbstractButton *)in_stack_ffffffffffffff40);
        *(bool *)&(pQVar1->wd).m_i = bVar2;
        break;
      case (QSize *)0x6:
        bVar2 = autoRepeat((QAbstractButton *)in_stack_ffffffffffffff40);
        *(bool *)&(pQVar1->wd).m_i = bVar2;
        break;
      case (QSize *)0x7:
        bVar2 = autoExclusive((QAbstractButton *)in_stack_ffffffffffffff40);
        *(bool *)&(pQVar1->wd).m_i = bVar2;
        break;
      case (QSize *)0x8:
        iVar3 = autoRepeatDelay((QAbstractButton *)in_stack_ffffffffffffff40);
        (pQVar1->wd).m_i = iVar3;
        break;
      case (QSize *)0x9:
        iVar3 = autoRepeatInterval((QAbstractButton *)in_stack_ffffffffffffff40);
        (pQVar1->wd).m_i = iVar3;
        break;
      case (QSize *)0xa:
        bVar2 = isDown((QAbstractButton *)in_stack_ffffffffffffff40);
        *(bool *)&(pQVar1->wd).m_i = bVar2;
      }
    }
    if (in_ESI == 2) {
      this = (QAbstractButton *)(ulong)in_EDX;
      bVar2 = SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0);
      down = SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0);
      switch(this) {
      case (QAbstractButton *)0x0:
        setText((QAbstractButton *)in_stack_ffffffffffffff48,(QString *)this);
        break;
      case (QAbstractButton *)0x1:
        setIcon(in_stack_ffffffffffffff50,(QIcon *)in_stack_ffffffffffffff48);
        break;
      case (QAbstractButton *)0x2:
        setIconSize(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        break;
      case (QAbstractButton *)0x3:
        setShortcut(in_stack_ffffffffffffff50,(QKeySequence *)in_stack_ffffffffffffff48);
        break;
      case (QAbstractButton *)0x4:
        setCheckable(this,bVar2);
        break;
      case (QAbstractButton *)0x5:
        setChecked(in_stack_ffffffffffffff50,down);
        break;
      case (QAbstractButton *)0x6:
        setAutoRepeat(in_stack_ffffffffffffff50,down);
        break;
      case (QAbstractButton *)0x7:
        setAutoExclusive(this,bVar2);
        break;
      case (QAbstractButton *)0x8:
        setAutoRepeatDelay(this,in_stack_ffffffffffffff3c);
        break;
      case (QAbstractButton *)0x9:
        setAutoRepeatInterval(this,in_stack_ffffffffffffff3c);
        break;
      case (QAbstractButton *)0xa:
        setDown(in_stack_ffffffffffffff50,down);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractButton *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pressed(); break;
        case 1: _t->released(); break;
        case 2: _t->clicked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->clicked(); break;
        case 4: _t->toggled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->setIconSize((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 6: _t->animateClick(); break;
        case 7: _t->click(); break;
        case 8: _t->toggle(); break;
        case 9: _t->setChecked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)()>(_a, &QAbstractButton::pressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)()>(_a, &QAbstractButton::released, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)(bool )>(_a, &QAbstractButton::clicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)(bool )>(_a, &QAbstractButton::toggled, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast<QIcon*>(_v) = _t->icon(); break;
        case 2: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 3: *reinterpret_cast<QKeySequence*>(_v) = _t->shortcut(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isCheckable(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isChecked(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->autoRepeat(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->autoExclusive(); break;
        case 8: *reinterpret_cast<int*>(_v) = _t->autoRepeatDelay(); break;
        case 9: *reinterpret_cast<int*>(_v) = _t->autoRepeatInterval(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->isDown(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 2: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 3: _t->setShortcut(*reinterpret_cast<QKeySequence*>(_v)); break;
        case 4: _t->setCheckable(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setChecked(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setAutoRepeat(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setAutoExclusive(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setAutoRepeatDelay(*reinterpret_cast<int*>(_v)); break;
        case 9: _t->setAutoRepeatInterval(*reinterpret_cast<int*>(_v)); break;
        case 10: _t->setDown(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}